

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O3

Abc_Ntk_t * Io_ReadBench(char *pFileName,int fCheck)

{
  int *piVar1;
  char cVar2;
  undefined8 *puVar3;
  size_t __size;
  bool bVar4;
  FILE *pFile;
  int iVar5;
  int iVar6;
  Extra_FileReader_t *p;
  char *pcVar7;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *p_00;
  ProgressBar *p_01;
  void *pvVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  char **pNamesIn;
  uint uVar15;
  char *pFlopOut;
  Mem_Flex_t *pMVar16;
  char *__format;
  long lVar17;
  ulong uVar18;
  uint uTruth [8];
  char *local_460;
  int local_43c [9];
  char local_418 [1000];
  
  p = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t,()=");
  if (p == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  local_43c[0] = fCheck;
  pcVar7 = Extra_FileReaderGetFileName(p);
  pNtk = Abc_NtkStartRead(pcVar7);
  pNtk->nConstrs = 0;
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  local_460 = (char *)malloc(100);
  p_00->pArray = local_460;
  pFile = _stdout;
  iVar5 = Extra_FileReaderGetFileSize(p);
  p_01 = Extra_ProgressBarStart(pFile,iVar5);
  pvVar8 = Extra_FileReaderGetTokens(p);
  if (pvVar8 != (void *)0x0) {
    bVar4 = false;
LAB_0032b7e7:
    iVar5 = Extra_FileReaderGetCurPosition(p);
    if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar5)) {
      Extra_ProgressBarUpdate_int(p_01,iVar5,(char *)0x0);
    }
    iVar5 = *(int *)((long)pvVar8 + 4);
    if (iVar5 != 1) {
      puVar3 = *(undefined8 **)((long)pvVar8 + 8);
      pcVar7 = (char *)*puVar3;
      iVar6 = strncmp(pcVar7,"INPUT",5);
      if (iVar6 != 0) {
        iVar6 = strncmp(pcVar7,"OUTPUT",5);
        pcVar12 = (char *)puVar3[1];
        if (iVar6 == 0) {
          Io_ReadCreatePo(pNtk,pcVar12);
          goto LAB_0032ba2c;
        }
        if (((*pcVar12 == 'D') && (pcVar12[1] == 'F')) && (pcVar12[2] == 'F')) {
          if (iVar5 == 6) {
            pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar7);
            pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
            Abc_ObjAddFanin(pAVar9,pAVar10);
            if (2 < *(int *)((long)pvVar8 + 4)) {
              lVar17 = 2;
              do {
                pcVar12 = *(char **)(*(long *)((long)pvVar8 + 8) + lVar17 * 8);
                sprintf(local_418,"%s_%s",pcVar7,pcVar12);
                pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar12);
                pAVar9 = Abc_NtkCreateNodeBuf(pNtk,pAVar9);
                pAVar10 = Abc_NtkFindOrCreateNet(pNtk,local_418);
                Abc_ObjAddFanin(pAVar10,pAVar9);
                pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
                Abc_ObjAddFanin(pAVar9,pAVar10);
                lVar17 = lVar17 + 1;
              } while (lVar17 < *(int *)((long)pvVar8 + 4));
            }
            pNtk->nConstrs = pNtk->nConstrs + 1;
          }
          else {
            pAVar9 = Io_ReadCreateLatch(pNtk,(char *)puVar3[2],pcVar7);
            uVar14 = *(uint *)&pAVar9->field_0x14 & 0xf;
            if (pcVar12[3] == '1') {
              if (uVar14 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
              }
              pAVar9->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
            }
            else if (pcVar12[3] == '0') {
              if (uVar14 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
              }
              pAVar9->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            }
            else {
              if (uVar14 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
              }
              pAVar9->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
            }
          }
          goto LAB_0032ba2c;
        }
        iVar6 = strcmp(pcVar12,"LUT");
        if (iVar6 == 0) {
          uVar14 = iVar5 - 3;
          if (iVar5 < 0xc) {
            pcVar7 = (char *)puVar3[2];
            if ((*pcVar7 == '0') && (pcVar7[1] == 'x')) {
              pcVar7 = pcVar7 + 2;
              uVar15 = (uint)(1 << ((byte)uVar14 & 0x1f)) >> 2;
              if (uVar14 < 2) {
                uVar15 = 1;
              }
              sVar11 = strlen(pcVar7);
              if (sVar11 < uVar15) {
                uVar15 = uVar15 - (int)sVar11;
                if (p_00->nCap < (int)uVar15) {
                  if (local_460 == (char *)0x0) {
                    local_460 = (char *)malloc((long)(int)uVar15);
                  }
                  else {
                    local_460 = (char *)realloc(local_460,(long)(int)uVar15);
                  }
                  p_00->pArray = local_460;
                  p_00->nCap = uVar15;
                }
                p_00->nSize = uVar15;
                if (0 < (int)uVar15) {
                  memset(local_460,0x30,(ulong)uVar15);
                }
                sVar11 = strlen(pcVar7);
                if (0 < (int)(uint)sVar11) {
                  uVar18 = 0;
                  do {
                    cVar2 = pcVar7[uVar18];
                    uVar15 = p_00->nSize;
                    if (uVar15 == p_00->nCap) {
                      if ((int)uVar15 < 0x10) {
                        if (p_00->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar12 = (char *)realloc(p_00->pArray,0x10);
                        }
                        p_00->pArray = pcVar12;
                        p_00->nCap = 0x10;
                      }
                      else {
                        __size = (ulong)uVar15 * 2;
                        if (p_00->pArray == (char *)0x0) {
                          pcVar12 = (char *)malloc(__size);
                        }
                        else {
                          pcVar12 = (char *)realloc(p_00->pArray,__size);
                        }
                        p_00->pArray = pcVar12;
                        p_00->nCap = (int)__size;
                      }
                    }
                    else {
                      pcVar12 = p_00->pArray;
                    }
                    p_00->nSize = uVar15 + 1;
                    pcVar12[(int)uVar15] = cVar2;
                    uVar18 = uVar18 + 1;
                  } while (((uint)sVar11 & 0x7fffffff) != uVar18);
                }
                uVar15 = p_00->nSize;
                if (uVar15 == p_00->nCap) {
                  if ((int)uVar15 < 0x10) {
                    if (p_00->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar7 = (char *)realloc(p_00->pArray,0x10);
                    }
                    p_00->pArray = pcVar7;
                    p_00->nCap = 0x10;
                  }
                  else {
                    sVar11 = (ulong)uVar15 * 2;
                    if (p_00->pArray == (char *)0x0) {
                      pcVar7 = (char *)malloc(sVar11);
                    }
                    else {
                      pcVar7 = (char *)realloc(p_00->pArray,sVar11);
                    }
                    p_00->pArray = pcVar7;
                    p_00->nCap = (int)sVar11;
                  }
                }
                else {
                  pcVar7 = p_00->pArray;
                }
                p_00->nSize = uVar15 + 1;
                pcVar7[(int)uVar15] = '\0';
                pcVar7 = p_00->pArray;
                local_460 = pcVar7;
              }
              iVar6 = Extra_ReadHexadecimal((uint *)(local_43c + 1),pcVar7,uVar14);
              if (iVar6 != 0) {
                pNamesIn = (char **)(puVar3 + 3);
                uVar18 = (ulong)(uint)(1 << ((char)iVar5 - 8U & 0x1f));
                uVar13 = uVar18;
                if (iVar5 < 9) {
                  uVar18 = 1;
                  uVar13 = uVar18;
                }
                do {
                  if ((long)uVar18 < 1) {
                    pAVar9 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar8 + 8),
                                               pNamesIn,0);
                    pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
                    pcVar7 = " 0\n";
                    goto LAB_0032c01f;
                  }
                  piVar1 = local_43c + uVar18;
                  uVar18 = uVar18 - 1;
                } while (*piVar1 == 0);
LAB_0032bf68:
                if (0 < (long)uVar13) goto code_r0x0032bf71;
                pAVar9 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar8 + 8),pNamesIn
                                           ,0);
                pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
                pcVar7 = " 1\n";
LAB_0032c01f:
                pcVar7 = Abc_SopRegister(pMVar16,pcVar7);
                goto LAB_0032c024;
              }
              pcVar12 = Extra_FileReaderGetFileName(p);
              __format = "%s: Reading hexadecimal number (%s) has failed.\n";
            }
            else {
              pcVar12 = Extra_FileReaderGetFileName(p);
              __format = 
              "%s: The LUT signature (%s) does not look like a hexadecimal beginning with \"0x\".\n"
              ;
            }
            printf(__format,pcVar12,pcVar7);
          }
          else {
            pcVar7 = Extra_FileReaderGetFileName(p);
            printf("%s: Currently cannot read truth tables with more than 8 inputs (%d).\n",pcVar7,
                   (ulong)uVar14);
          }
          goto LAB_0032c31a;
        }
        iVar5 = iVar5 + -2;
        pAVar9 = Io_ReadCreateNode(pNtk,pcVar7,(char **)(puVar3 + 2),iVar5);
        iVar6 = strcmp(pcVar12,"AND");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"and"), iVar6 == 0)) {
          pcVar7 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
          (pAVar9->field_5).pData = pcVar7;
          goto LAB_0032ba2c;
        }
        cVar2 = *pcVar12;
        if (cVar2 != 'o') {
          if ((cVar2 != 'O') || (pcVar12[1] != 'R')) goto LAB_0032bb27;
LAB_0032bb1b:
          if (pcVar12[2] != '\0') goto LAB_0032bb27;
          pcVar7 = Abc_SopCreateOr((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
LAB_0032c068:
          (pAVar9->field_5).pData = pcVar7;
          goto LAB_0032ba2c;
        }
        if (pcVar12[1] == 'r') goto LAB_0032bb1b;
LAB_0032bb27:
        iVar6 = strcmp(pcVar12,"NAND");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"nand"), iVar6 == 0)) {
          pcVar7 = Abc_SopCreateNand((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032c068;
        }
        iVar6 = strcmp(pcVar12,"NOR");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"nor"), iVar6 == 0)) {
          pcVar7 = Abc_SopCreateNor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032c068;
        }
        iVar6 = strcmp(pcVar12,"XOR");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"xor"), iVar6 == 0)) {
          pcVar7 = Abc_SopCreateXor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032c068;
        }
        iVar6 = strcmp(pcVar12,"NXOR");
        if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"XNOR"), iVar6 == 0)) ||
            (iVar6 = strcmp(pcVar12,"nxor"), iVar6 == 0)) ||
           (iVar6 = strcmp(pcVar12,"xnor"), iVar6 == 0)) {
          pcVar7 = Abc_SopCreateNxor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          goto LAB_0032c068;
        }
        if ((((cVar2 == 'B') && (pcVar12[1] == 'U')) && (pcVar12[2] == 'F')) ||
           (iVar5 = strcmp(pcVar12,"buf"), iVar5 == 0)) {
          pcVar7 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
          goto LAB_0032c068;
        }
        iVar5 = strcmp(pcVar12,"NOT");
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar12,"not"), iVar5 == 0)) {
          pcVar7 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
          goto LAB_0032c068;
        }
        if (cVar2 == 'M') {
          if (((pcVar12[1] != 'U') || (pcVar12[2] != 'X')) &&
             (iVar5 = strcmp(pcVar12,"mux"), iVar5 != 0)) goto LAB_0032c383;
LAB_0032c0dd:
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar7 = "0-1 1\n11- 1\n";
LAB_0032c0eb:
          pcVar7 = Abc_SopRegister(pMVar16,pcVar7);
          goto LAB_0032c068;
        }
        iVar5 = strcmp(pcVar12,"mux");
        if (iVar5 == 0) goto LAB_0032c0dd;
        if (cVar2 == 'v') {
          if ((pcVar12[1] != 'd') || (pcVar12[2] != 'd')) goto LAB_0032c383;
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar7 = " 1\n";
          goto LAB_0032c0eb;
        }
        if (((cVar2 == 'g') && (pcVar12[1] == 'n')) && (pcVar12[2] == 'd')) {
          pMVar16 = (Mem_Flex_t *)pNtk->pManFunc;
          pcVar7 = " 0\n";
          goto LAB_0032c0eb;
        }
LAB_0032c383:
        uVar14 = Extra_FileReaderGetLineNumber(p,0);
        printf("Io_ReadBenchNetwork(): Cannot determine gate type \"%s\" in line %d.\n",pcVar12,
               (ulong)uVar14);
        goto LAB_0032c377;
      }
      Io_ReadCreatePi(pNtk,(char *)puVar3[1]);
      goto LAB_0032ba2c;
    }
    pcVar7 = Extra_FileReaderGetFileName(p);
    printf("%s: Wrong input file format.\n",pcVar7);
LAB_0032c31a:
    if (local_460 != (char *)0x0) {
      free(local_460);
    }
    free(p_00);
    goto LAB_0032c333;
  }
  bVar4 = true;
LAB_0032c14a:
  Extra_ProgressBarStop(p_01);
  if (local_460 != (char *)0x0) {
    free(local_460);
  }
  free(p_00);
  pAVar9 = Abc_NtkFindNet(pNtk,"gnd");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"gnd",0);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"1");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 0 fanin to non-driven net \"1\".");
    Io_ReadCreateConst(pNtk,"1",0);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"vdd");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"vdd",1);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"2");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 1 fanin to non-driven net \"2\".");
    Io_ReadCreateConst(pNtk,"2",1);
  }
  Abc_NtkFinalizeRead(pNtk);
  if (bVar4) {
LAB_0032c263:
    Extra_FileReaderFree(p);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      if (local_43c[0] == 0) {
        return pNtk;
      }
      iVar5 = Abc_NtkCheckRead(pNtk);
      if (iVar5 != 0) {
        return pNtk;
      }
      puts("Io_ReadBench: The network check has failed.");
      Abc_NtkDelete(pNtk);
    }
  }
  else {
    iVar5 = Abc_NtkToBdd(pNtk);
    if (iVar5 == 0) {
      pcVar7 = "Io_ReadBenchNetwork(): Converting to BDD has failed.";
    }
    else {
      iVar5 = Abc_NtkToSop(pNtk,-1,1000000000);
      if (iVar5 != 0) goto LAB_0032c263;
      pcVar7 = "Io_ReadBenchNetwork(): Converting to SOP has failed.";
    }
    puts(pcVar7);
LAB_0032c333:
    Abc_NtkDelete(pNtk);
    Extra_FileReaderFree(p);
  }
  return (Abc_Ntk_t *)0x0;
code_r0x0032bf71:
  piVar1 = local_43c + uVar13;
  uVar13 = uVar13 - 1;
  if (*piVar1 != -1) goto code_r0x0032bf7c;
  goto LAB_0032bf68;
code_r0x0032bf7c:
  pAVar9 = Io_ReadCreateNode(pNtk,(char *)**(undefined8 **)((long)pvVar8 + 8),pNamesIn,uVar14);
  if (iVar5 < 4) {
    __assert_fail("nNames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBench.c"
                  ,0xd7,"Abc_Ntk_t *Io_ReadBenchNetwork(Extra_FileReader_t *)");
  }
  if (iVar5 == 4) {
    if (*pcVar7 == '1') {
      pcVar7 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
    }
    else {
      if (*pcVar7 != '2') {
        pcVar12 = Extra_FileReaderGetFileName(p);
        printf("%s: Reading truth table (%s) of single-input node has failed.\n",pcVar12,pcVar7);
LAB_0032c377:
        Vec_StrFree(p_00);
        goto LAB_0032c333;
      }
      pcVar7 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
    }
  }
  else {
    pcVar7 = Abc_SopCreateFromTruth((Mem_Flex_t *)pNtk->pManFunc,uVar14,(uint *)(local_43c + 1));
  }
LAB_0032c024:
  (pAVar9->field_5).pData = pcVar7;
  bVar4 = true;
LAB_0032ba2c:
  pvVar8 = Extra_FileReaderGetTokens(p);
  if (pvVar8 == (void *)0x0) goto LAB_0032c142;
  goto LAB_0032b7e7;
LAB_0032c142:
  bVar4 = !bVar4;
  goto LAB_0032c14a;
}

Assistant:

Abc_Ntk_t * Io_ReadBench( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t,()=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadBenchNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBench: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}